

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void receive_particle_slice(int left,int width,int rank,int x_diff)

{
  vector<int,_std::allocator<int>_> *particle_numbers_00;
  vector<particle,_std::allocator<particle>_> *this;
  size_type sVar1;
  reference pvVar2;
  undefined4 in_EDX;
  int in_ESI;
  vector<particle,_std::allocator<particle>_> particles;
  vector<int,_std::allocator<int>_> particle_numbers;
  int particles_to_receive;
  allocator_type *in_stack_ffffffffffffff70;
  allocator_type *__a;
  size_type in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *this_00;
  int x_diff_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  undefined1 *puVar3;
  allocator_type local_61;
  vector<particle,_std::allocator<particle>_> local_60;
  undefined1 local_31;
  vector<int,_std::allocator<int>_> local_30;
  undefined4 local_14 [2];
  undefined4 local_c;
  int local_8;
  
  local_c = in_EDX;
  local_8 = in_ESI;
  MPI_Recv(local_14,1,&ompi_mpi_int,in_EDX,0,&ompi_mpi_comm_world,0);
  particle_numbers_00 = (vector<int,_std::allocator<int>_> *)(long)(local_8 * ny_global * nz_global)
  ;
  puVar3 = &local_31;
  std::allocator<int>::allocator((allocator<int> *)0x147986);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<int>::~allocator((allocator<int> *)0x1479a6);
  this_00 = &local_30;
  this = (vector<particle,_std::allocator<particle>_> *)
         std::vector<int,_std::allocator<int>_>::operator[](this_00,0);
  sVar1 = std::vector<int,_std::allocator<int>_>::size(this_00);
  MPI_Recv(this,sVar1 & 0xffffffff,&ompi_mpi_int,local_c,1,&ompi_mpi_comm_world,0);
  __a = &local_61;
  std::allocator<particle>::allocator((allocator<particle> *)0x147a17);
  std::vector<particle,_std::allocator<particle>_>::vector(this,(size_type)this_00,__a);
  x_diff_00 = (int)((ulong)this_00 >> 0x20);
  std::allocator<particle>::~allocator((allocator<particle> *)0x147a37);
  pvVar2 = std::vector<particle,_std::allocator<particle>_>::operator[](&local_60,0);
  MPI_Recv(pvVar2,local_14[0],MPI_PARTICLE,local_c,2,&ompi_mpi_comm_world,0);
  unpack_particle_slice((int)((ulong)puVar3 >> 0x20),(int)puVar3,particle_numbers_00,this,x_diff_00)
  ;
  std::vector<particle,_std::allocator<particle>_>::~vector
            ((vector<particle,_std::allocator<particle>_> *)__a);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  return;
}

Assistant:

void receive_particle_slice(int left, int width, int rank, int x_diff) {
    int particles_to_receive;
    MPI_Recv(&particles_to_receive, 1, MPI_INT, rank, 0, MPI_COMM_WORLD, MPI_STATUS_IGNORE);

    vector<int> particle_numbers(width * ny_global * nz_global);
    MPI_Recv(&(particle_numbers[0]), particle_numbers.size(), MPI_INT, rank, 1, MPI_COMM_WORLD, MPI_STATUS_IGNORE);

    vector<particle> particles(particles_to_receive);

    MPI_Recv(&(particles[0]), particles_to_receive, MPI_PARTICLE, rank, 2, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
    unpack_particle_slice(left, width, particle_numbers, particles, x_diff);
}